

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int CVmObjFile::s_getp_deleteFile(vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  CVmNetFile *this;
  vm_obj_id_t *in_RSI;
  vm_val_t *in_RDI;
  CVmNetFile *netfile;
  int access;
  vm_rcdesc rc;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff72;
  unsigned_short method_idx;
  vm_obj_id_t self;
  vm_val_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  if (in_RSI == (vm_obj_id_t *)0x0) {
    self = 0;
  }
  else {
    self = *in_RSI;
  }
  if ((s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_deleteFile::desc,1);
    __cxa_guard_release(&s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,
                     (uint *)CONCAT44(self,CONCAT22(in_stack_ffffffffffffff72,
                                                    in_stack_ffffffffffffff70)),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff68);
  if (iVar1 == 0) {
    vVar2 = CVmMetaclass::get_class_obj
                      ((CVmMetaclass *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                      );
    uVar3 = (undefined2)vVar2;
    method_idx = (unsigned_short)(vVar2 >> 0x10);
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_stack_ffffffffffffff78,self,method_idx,in_stack_ffffffffffffff68,0);
    iVar1 = (int)&stack0xffffffffffffff84;
    this = get_filename_and_access
                     ((vm_rcdesc *)CONCAT44(0x1000,in_stack_ffffffffffffff80),
                      (int *)in_stack_ffffffffffffff78,self,CONCAT22(method_idx,uVar3),
                      (char *)in_stack_ffffffffffffff68);
    CVmNetFile::close(this,iVar1);
    CVmStack::discard(1);
    vm_val_t::set_nil(in_RDI);
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_deleteFile(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the filename; use the DELETE access mode */
    vm_rcdesc rc(vmg_ "File.deleteFile",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_DELETE_FILE, G_stk->get(0), argc);
    int access = VMOBJFILE_ACCESS_DELETE;
    CVmNetFile *netfile = get_filename_and_access(
        vmg_ &rc, &access, FALSE, OSFTUNK, "application/octet-stream");

    /* close the network file descriptor - this will delete the file */
    netfile->close(vmg0_);

    /* discard arguments */
    G_stk->discard(1);

    /* no return */
    retval->set_nil();

    /* handled */
    return TRUE;
}